

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O0

tmbstr get_escaped_name(ctmbstr name)

{
  char cVar1;
  char *local_28;
  ctmbstr c;
  uint len;
  char aux [2];
  tmbstr escpName;
  ctmbstr name_local;
  
  c._0_4_ = 0;
  for (local_28 = name; *local_28 != '\0'; local_28 = local_28 + 1) {
    cVar1 = *local_28;
    if (cVar1 == '\"') {
      c._0_4_ = (int)c + 6;
    }
    else if ((cVar1 == '<') || (cVar1 == '>')) {
      c._0_4_ = (int)c + 4;
    }
    else {
      c._0_4_ = (int)c + 1;
    }
  }
  _len = (char *)malloc((ulong)((int)c + 1));
  if (_len == (char *)0x0) {
    outOfMemory();
  }
  *_len = '\0';
  c._7_1_ = 0;
  for (local_28 = name; *local_28 != '\0'; local_28 = local_28 + 1) {
    cVar1 = *local_28;
    if (cVar1 == '\"') {
      strcat(_len,"&quot;");
    }
    else if (cVar1 == '<') {
      strcat(_len,"&lt;");
    }
    else if (cVar1 == '>') {
      strcat(_len,"&gt;");
    }
    else {
      c._6_1_ = *local_28;
      strcat(_len,(char *)((long)&c + 6));
    }
  }
  return _len;
}

Assistant:

static tmbstr get_escaped_name( ctmbstr name )
{
    tmbstr escpName;
    char aux[2];
    uint len = 0;
    ctmbstr c;
    for(c=name; *c!='\0'; ++c)
        switch(*c)
    {
        case '<':
        case '>':
            len += 4;
            break;
        case '"':
            len += 6;
            break;
        default:
            len += 1;
            break;
    }

    escpName = (tmbstr)malloc(len+1);
    if (!escpName) outOfMemory();
    escpName[0] = '\0';

    aux[1] = '\0';
    for(c=name; *c!='\0'; ++c)
        switch(*c)
    {
        case '<':
            strcat(escpName, "&lt;");
            break;
        case '>':
            strcat(escpName, "&gt;");
            break;
        case '"':
            strcat(escpName, "&quot;");
            break;
        default:
            aux[0] = *c;
            strcat(escpName, aux);
            break;
    }

    return escpName;
}